

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O1

duckdb * __thiscall
duckdb::ParquetElementString<duckdb_parquet::FieldRepetitionType::type_const&>
          (duckdb *this,type *value,bool is_set)

{
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  LogicalType aLStack_48 [24];
  string local_30;
  
  if (CONCAT31(in_register_00000011,is_set) == 0) {
    duckdb::LogicalType::LogicalType(aLStack_48,SQLNULL);
    duckdb::Value::Value((Value *)this,aLStack_48);
    duckdb::LogicalType::~LogicalType(aLStack_48);
  }
  else {
    ConvertParquetElementToString<duckdb_parquet::FieldRepetitionType::type_const&>
              (&local_30,(duckdb *)value,
               (type *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,is_set)));
    duckdb::Value::Value((Value *)this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

Value ParquetElementString(T &&value, bool is_set) {
	if (!is_set) {
		return Value();
	}
	return Value(ConvertParquetElementToString(value));
}